

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool tinyobj::LoadObjWithCallback
               (istream *inStream,callback_t *callback,void *user_data,MaterialReader *readMatFn,
               string *warn,string *err)

{
  code *pcVar1;
  ulong uVar2;
  long *plVar3;
  string *psVar4;
  bool bVar5;
  int iVar6;
  size_type sVar7;
  char *pcVar8;
  size_t sVar9;
  size_type sVar10;
  reference pvVar11;
  pointer ppVar12;
  real_t *prVar13;
  reference ppcVar14;
  long *in_RCX;
  string *in_RDX;
  long *in_RSI;
  string *in_R8;
  string *in_R9;
  vertex_index_t vVar15;
  string object_name;
  stringstream ss_1;
  size_t j;
  string str;
  bool ok;
  string err_mtl;
  string warn_mtl;
  size_t s;
  bool found;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  const_iterator it;
  int newMaterialId;
  string namebuf;
  stringstream ss;
  size_t n;
  index_t idx;
  vertex_index_t vi;
  real_t z_2;
  real_t y_2;
  real_t x_2;
  real_t z_1;
  real_t y_1;
  real_t x_1;
  real_t w;
  real_t z;
  real_t y;
  real_t x;
  char *token;
  string linebuf;
  vector<const_char_*,_std::allocator<const_char_*>_> names_out;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> indices;
  int material_id;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  material_map;
  stringstream errss;
  string *in_stack_fffffffffffff748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff758;
  string *in_stack_fffffffffffff760;
  istream *in_stack_fffffffffffff768;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffff770;
  real_t *in_stack_fffffffffffff778;
  undefined7 in_stack_fffffffffffff780;
  undefined1 in_stack_fffffffffffff787;
  string *in_stack_fffffffffffff790;
  reference in_stack_fffffffffffff798;
  undefined7 in_stack_fffffffffffff7a0;
  byte in_stack_fffffffffffff7a7;
  allocator *in_stack_fffffffffffff7b8;
  string local_7a0 [32];
  string local_780 [32];
  stringstream local_760 [16];
  ostream local_750 [376];
  real_t *local_5d8;
  string local_5d0 [32];
  int local_5b0;
  allocator local_5a9;
  string local_5a8 [39];
  byte local_581;
  string local_580 [32];
  string local_560 [32];
  ulong local_540;
  byte local_532;
  allocator local_531;
  string local_530 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_510;
  string local_4f8 [32];
  string local_4d8 [32];
  iterator local_4b8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_4b0;
  iterator local_4a8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_4a0;
  int local_494;
  string local_490 [32];
  stringstream local_470 [16];
  ostream local_460 [376];
  size_t local_2e8;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  vertex_index_t local_2d0;
  vertex_index_t local_2c0;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  undefined4 local_2a4;
  undefined4 local_2a0;
  undefined4 local_29c;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 local_28c;
  char *local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  vector<const_char_*,_std::allocator<const_char_*>_> local_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> local_220;
  vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> local_208;
  int local_1ec;
  undefined1 local_1e8 [48];
  stringstream local_1b8 [392];
  string *local_30;
  string *local_28;
  long *local_20;
  string *local_18;
  long *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)0x1af771);
  local_1ec = -1;
  std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::vector
            ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)0x1af789);
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::vector
            ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)0x1af796);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1af7ab);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
            (size_type)in_stack_fffffffffffff778);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x1af7cc);
  std::__cxx11::string::string((string *)&local_280);
  do {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  do {
                    do {
                      iVar6 = std::istream::peek();
                      if (iVar6 == -1) {
                        if (local_30 != (string *)0x0) {
                          std::__cxx11::stringstream::str();
                          std::__cxx11::string::operator+=(local_30,local_7a0);
                          std::__cxx11::string::~string(local_7a0);
                        }
                        local_5b0 = 1;
                        std::__cxx11::string::~string((string *)&local_280);
                        std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                   in_stack_fffffffffffff760);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)in_stack_fffffffffffff760);
                        std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::
                        ~vector((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *
                                )in_stack_fffffffffffff760);
                        std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::~vector
                                  ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                                   in_stack_fffffffffffff760);
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                *)0x1b0b31);
                        std::__cxx11::stringstream::~stringstream(local_1b8);
                        return true;
                      }
                      safeGetline(in_stack_fffffffffffff768,in_stack_fffffffffffff760);
                      sVar7 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              size(&local_280);
                      if (sVar7 != 0) {
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                  (&local_280);
                        pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&local_280);
                        if (*pcVar8 == '\n') {
                          sVar7 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::size(&local_280);
                          std::__cxx11::string::erase((ulong)&local_280,sVar7 - 1);
                        }
                      }
                      sVar7 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              size(&local_280);
                      if (sVar7 != 0) {
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                  (&local_280);
                        pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&local_280);
                        if (*pcVar8 == '\r') {
                          sVar7 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::size(&local_280);
                          std::__cxx11::string::erase((ulong)&local_280,sVar7 - 1);
                        }
                      }
                      bVar5 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x1af96d);
                    } while (bVar5);
                    local_288 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                c_str(in_stack_fffffffffffff750);
                    sVar9 = strspn(local_288," \t");
                    local_288 = local_288 + sVar9;
                  } while ((*local_288 == '\0') || (*local_288 == '#'));
                  if ((*local_288 != 'v') || ((local_288[1] != ' ' && (local_288[1] != '\t'))))
                  break;
                  local_288 = local_288 + 2;
                  parseV((real_t *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                         in_stack_fffffffffffff778,(real_t *)in_stack_fffffffffffff770,
                         (real_t *)in_stack_fffffffffffff768,(char **)in_stack_fffffffffffff760,
                         (double)in_stack_fffffffffffff758,(double)in_stack_fffffffffffff750,
                         (double)in_stack_fffffffffffff748,8.73527330407512e-318);
                  if (*local_10 != 0) {
                    (*(code *)*local_10)(local_28c,local_290,local_294,local_298,local_18);
                  }
                }
                if ((*local_288 != 'v') ||
                   ((local_288[1] != 'n' || ((local_288[2] != ' ' && (local_288[2] != '\t'))))))
                break;
                local_288 = local_288 + 3;
                parseReal3((real_t *)in_stack_fffffffffffff770,(real_t *)in_stack_fffffffffffff768,
                           (real_t *)in_stack_fffffffffffff760,(char **)in_stack_fffffffffffff758,
                           (double)in_stack_fffffffffffff750,(double)in_stack_fffffffffffff748,
                           8.73639483309118e-318);
                if (local_10[1] != 0) {
                  (*(code *)local_10[1])(local_29c,local_2a0,local_2a4,local_18);
                }
              }
              if ((*local_288 != 'v') ||
                 ((local_288[1] != 't' || ((local_288[2] != ' ' && (local_288[2] != '\t'))))))
              break;
              local_288 = local_288 + 3;
              parseReal3((real_t *)in_stack_fffffffffffff770,(real_t *)in_stack_fffffffffffff768,
                         (real_t *)in_stack_fffffffffffff760,(char **)in_stack_fffffffffffff758,
                         (double)in_stack_fffffffffffff750,(double)in_stack_fffffffffffff748,
                         8.73748177751203e-318);
              if (local_10[2] != 0) {
                (*(code *)local_10[2])(local_2a8,local_2ac,local_2b0,local_18);
              }
            }
            if ((*local_288 != 'f') || ((local_288[1] != ' ' && (local_288[1] != '\t')))) break;
            local_288 = local_288 + 2;
            sVar9 = strspn(local_288," \t");
            local_288 = local_288 + sVar9;
            std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::clear
                      ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)0x1afcf0);
            while( true ) {
              bVar5 = true;
              if ((*local_288 != '\r') && (bVar5 = true, *local_288 != '\n')) {
                bVar5 = *local_288 == '\0';
              }
              if (bVar5) break;
              vVar15 = parseRawTriple((char **)in_stack_fffffffffffff750);
              local_2d8 = vVar15.vn_idx;
              local_2c0.v_idx = vVar15.v_idx;
              local_2dc = local_2c0.v_idx;
              local_2c0.vt_idx = vVar15.vt_idx;
              local_2d4 = local_2c0.vt_idx;
              local_2d0 = vVar15;
              local_2c0 = vVar15;
              std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                        ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                         in_stack_fffffffffffff760,(value_type *)in_stack_fffffffffffff758);
              local_2e8 = strspn(local_288," \t\r");
              local_288 = local_288 + local_2e8;
            }
            if (local_10[3] != 0) {
              sVar10 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::size
                                 (&local_208);
              psVar4 = local_18;
              if (sVar10 != 0) {
                pcVar1 = (code *)local_10[3];
                pvVar11 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::at
                                    ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                                     in_stack_fffffffffffff750,(size_type)in_stack_fffffffffffff748)
                ;
                sVar10 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::size
                                   (&local_208);
                (*pcVar1)(psVar4,pvVar11,sVar10 & 0xffffffff);
              }
            }
          }
          iVar6 = strncmp(local_288,"usemtl",6);
          if ((iVar6 != 0) || ((local_288[6] != ' ' && (local_288[6] != '\t')))) break;
          local_288 = local_288 + 7;
          std::__cxx11::stringstream::stringstream(local_470);
          std::operator<<(local_460,local_288);
          std::__cxx11::stringstream::str();
          local_494 = -1;
          local_4a8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)in_stack_fffffffffffff748,(key_type *)0x1aff76);
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
          ::_Rb_tree_const_iterator(&local_4a0,&local_4a8);
          local_4b8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *)in_stack_fffffffffffff748);
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
          ::_Rb_tree_const_iterator(&local_4b0,&local_4b8);
          bVar5 = std::operator!=(&local_4a0,&local_4b0);
          if (bVar5) {
            ppVar12 = std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                    *)0x1afff7);
            local_494 = ppVar12->second;
          }
          else if ((local_28 != (string *)0x0) && (local_10[4] == 0)) {
            std::operator+((char *)in_stack_fffffffffffff798,in_stack_fffffffffffff790);
            std::operator+(in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750);
            std::__cxx11::string::operator+=(local_28,local_4d8);
            std::__cxx11::string::~string(local_4d8);
            std::__cxx11::string::~string(local_4f8);
          }
          psVar4 = local_18;
          if (local_494 != local_1ec) {
            local_1ec = local_494;
          }
          if (local_10[4] != 0) {
            pcVar1 = (code *)local_10[4];
            pcVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::c_str(in_stack_fffffffffffff750);
            (*pcVar1)(psVar4,pcVar8,local_1ec);
          }
          std::__cxx11::string::~string(local_490);
          std::__cxx11::stringstream::~stringstream(local_470);
        }
        iVar6 = strncmp(local_288,"mtllib",6);
        if ((iVar6 == 0) && ((local_288[6] == ' ' || (local_288[6] == '\t')))) break;
        if ((*local_288 == 'g') && ((local_288[1] == ' ' || (local_288[1] == '\t')))) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x1b06e9);
          while( true ) {
            in_stack_fffffffffffff787 = true;
            if ((*local_288 != '\r') && (in_stack_fffffffffffff787 = true, *local_288 != '\n')) {
              in_stack_fffffffffffff787 = *local_288 == '\0';
            }
            if (((in_stack_fffffffffffff787 ^ 0xff) & 1) == 0) break;
            parseString_abi_cxx11_((char **)in_stack_fffffffffffff7b8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff760,in_stack_fffffffffffff758);
            sVar9 = strspn(local_288," \t\r");
            local_288 = local_288 + sVar9;
            std::__cxx11::string::~string(local_5d0);
          }
          if (local_10[6] != 0) {
            sVar10 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size(&local_238);
            if (sVar10 < 2) {
              (*(code *)local_10[6])(local_18,0);
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_238);
              std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
                        (in_stack_fffffffffffff770,(size_type)in_stack_fffffffffffff768);
              local_5d8 = (real_t *)0x0;
              while( true ) {
                in_stack_fffffffffffff778 = local_5d8;
                prVar13 = (real_t *)
                          std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&local_260)
                ;
                if (prVar13 <= in_stack_fffffffffffff778) break;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&local_238,(long)local_5d8 + 1);
                in_stack_fffffffffffff770 =
                     (vector<const_char_*,_std::allocator<const_char_*>_> *)
                     std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::c_str(in_stack_fffffffffffff750);
                ppcVar14 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                                     (&local_260,(size_type)local_5d8);
                *ppcVar14 = (value_type)in_stack_fffffffffffff770;
                local_5d8 = (real_t *)((long)local_5d8 + 1);
              }
              in_stack_fffffffffffff758 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10[6];
              in_stack_fffffffffffff760 = local_18;
              in_stack_fffffffffffff768 =
                   (istream *)
                   std::vector<const_char_*,_std::allocator<const_char_*>_>::at
                             ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                              in_stack_fffffffffffff750,(size_type)in_stack_fffffffffffff748);
              sVar10 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&local_260);
              (*(code *)in_stack_fffffffffffff758)
                        (in_stack_fffffffffffff760,in_stack_fffffffffffff768,sVar10 & 0xffffffff);
            }
          }
        }
        else if ((*local_288 == 'o') && ((local_288[1] == ' ' || (local_288[1] == '\t')))) {
          local_288 = local_288 + 2;
          std::__cxx11::stringstream::stringstream(local_760);
          std::operator<<(local_750,local_288);
          std::__cxx11::stringstream::str();
          if (local_10[7] != 0) {
            in_stack_fffffffffffff750 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10[7];
            in_stack_fffffffffffff748 = local_18;
            pcVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::c_str(in_stack_fffffffffffff750);
            (*(code *)in_stack_fffffffffffff750)(in_stack_fffffffffffff748,pcVar8);
          }
          local_5b0 = 2;
          std::__cxx11::string::~string(local_780);
          std::__cxx11::stringstream::~stringstream(local_760);
        }
      }
    } while (local_20 == (long *)0x0);
    local_288 = local_288 + 7;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1b024b);
    pcVar8 = local_288;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_530,pcVar8,&local_531);
    SplitString((string *)CONCAT17(in_stack_fffffffffffff7a7,in_stack_fffffffffffff7a0),
                (char)((ulong)in_stack_fffffffffffff798 >> 0x38),
                (char)((ulong)in_stack_fffffffffffff798 >> 0x30),
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff790);
    std::__cxx11::string::~string(local_530);
    std::allocator<char>::~allocator((allocator<char> *)&local_531);
    bVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff760);
    if (bVar5) {
      if (local_28 != (string *)0x0) {
        std::__cxx11::string::operator+=
                  (local_28,"Looks like empty filename for mtllib. Use default material. \n");
      }
    }
    else {
      local_532 = 0;
      local_540 = 0;
      while( true ) {
        uVar2 = local_540;
        sVar10 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(&local_510);
        if (sVar10 <= uVar2) break;
        std::__cxx11::string::string(local_560);
        std::__cxx11::string::string(local_580);
        plVar3 = local_20;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_510,local_540);
        pcVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str(in_stack_fffffffffffff750);
        in_stack_fffffffffffff7b8 = &local_5a9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5a8,pcVar8,in_stack_fffffffffffff7b8);
        in_stack_fffffffffffff7a7 =
             (**(code **)(*plVar3 + 0x10))
                       (plVar3,local_5a8,&local_220,local_1e8,local_560,local_580);
        std::__cxx11::string::~string(local_5a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
        local_581 = in_stack_fffffffffffff7a7 & 1;
        if (local_28 != (string *)0x0) {
          bVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x1b049c);
          if (!bVar5) {
            std::__cxx11::string::operator+=(local_28,local_560);
          }
        }
        if (local_30 != (string *)0x0) {
          bVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x1b0533);
          if (!bVar5) {
            std::__cxx11::string::operator+=(local_30,local_580);
          }
        }
        if ((local_581 & 1) == 0) {
          local_5b0 = 0;
        }
        else {
          local_532 = 1;
          local_5b0 = 6;
        }
        std::__cxx11::string::~string(local_580);
        std::__cxx11::string::~string(local_560);
        if (local_5b0 != 0) break;
        local_540 = local_540 + 1;
      }
      if ((local_532 & 1) == 0) {
        if (local_28 != (string *)0x0) {
          std::__cxx11::string::operator+=
                    (local_28,"Failed to load material file(s). Use default material.\n");
        }
      }
      else if (local_10[5] != 0) {
        pcVar1 = (code *)local_10[5];
        in_stack_fffffffffffff790 = local_18;
        in_stack_fffffffffffff798 =
             std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::at
                       ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                        in_stack_fffffffffffff750,(size_type)in_stack_fffffffffffff748);
        sVar10 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::size
                           (&local_220);
        (*pcVar1)(in_stack_fffffffffffff790,in_stack_fffffffffffff798,sVar10 & 0xffffffff);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff760);
  } while( true );
}

Assistant:

bool LoadObjWithCallback(std::istream &inStream, const callback_t &callback,
                         void *user_data /*= NULL*/,
                         MaterialReader *readMatFn /*= NULL*/,
                         std::string *warn, /* = NULL*/
                         std::string *err /*= NULL*/) {
  std::stringstream errss;

  // material
  std::map<std::string, int> material_map;
  int material_id = -1;  // -1 = invalid

  std::vector<index_t> indices;
  std::vector<material_t> materials;
  std::vector<std::string> names;
  names.reserve(2);
  std::vector<const char *> names_out;

  std::string linebuf;
  while (inStream.peek() != -1) {
    safeGetline(inStream, linebuf);

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // vertex
    if (token[0] == 'v' && IS_SPACE((token[1]))) {
      token += 2;
      // TODO(syoyo): Support parsing vertex color extension.
      real_t x, y, z, w;  // w is optional. default = 1.0
      parseV(&x, &y, &z, &w, &token);
      if (callback.vertex_cb) {
        callback.vertex_cb(user_data, x, y, z, w);
      }
      continue;
    }

    // normal
    if (token[0] == 'v' && token[1] == 'n' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;
      parseReal3(&x, &y, &z, &token);
      if (callback.normal_cb) {
        callback.normal_cb(user_data, x, y, z);
      }
      continue;
    }

    // texcoord
    if (token[0] == 'v' && token[1] == 't' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;  // y and z are optional. default = 0.0
      parseReal3(&x, &y, &z, &token);
      if (callback.texcoord_cb) {
        callback.texcoord_cb(user_data, x, y, z);
      }
      continue;
    }

    // face
    if (token[0] == 'f' && IS_SPACE((token[1]))) {
      token += 2;
      token += strspn(token, " \t");

      indices.clear();
      while (!IS_NEW_LINE(token[0])) {
        vertex_index_t vi = parseRawTriple(&token);

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        indices.push_back(idx);
        size_t n = strspn(token, " \t\r");
        token += n;
      }

      if (callback.index_cb && indices.size() > 0) {
        callback.index_cb(user_data, &indices.at(0),
                          static_cast<int>(indices.size()));
      }

      continue;
    }

    // use mtl
    if ((0 == strncmp(token, "usemtl", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      std::stringstream ss;
      ss << token;
      std::string namebuf = ss.str();

      int newMaterialId = -1;
      std::map<std::string, int>::const_iterator it = material_map.find(namebuf);
      if (it != material_map.end()) {
        newMaterialId = it->second;
      } else {
        // { warn!! material not found }
        if (warn && (!callback.usemtl_cb)) {
          (*warn) += "material [ " + namebuf + " ] not found in .mtl\n";
        }
      }

      if (newMaterialId != material_id) {
        material_id = newMaterialId;
      }

      if (callback.usemtl_cb) {
        callback.usemtl_cb(user_data, namebuf.c_str(), material_id);
      }

      continue;
    }

    // load mtl
    if ((0 == strncmp(token, "mtllib", 6)) && IS_SPACE((token[6]))) {
      if (readMatFn) {
        token += 7;

        std::vector<std::string> filenames;
        SplitString(std::string(token), ' ', '\\', filenames);

        if (filenames.empty()) {
          if (warn) {
            (*warn) +=
                "Looks like empty filename for mtllib. Use default "
                "material. \n";
          }
        } else {
          bool found = false;
          for (size_t s = 0; s < filenames.size(); s++) {
            std::string warn_mtl;
            std::string err_mtl;
            bool ok = (*readMatFn)(filenames[s].c_str(), &materials,
                                   &material_map, &warn_mtl, &err_mtl);

            if (warn && (!warn_mtl.empty())) {
              (*warn) += warn_mtl;  // This should be warn message.
            }

            if (err && (!err_mtl.empty())) {
              (*err) += err_mtl;
            }

            if (ok) {
              found = true;
              break;
            }
          }

          if (!found) {
            if (warn) {
              (*warn) +=
                  "Failed to load material file(s). Use default "
                  "material.\n";
            }
          } else {
            if (callback.mtllib_cb) {
              callback.mtllib_cb(user_data, &materials.at(0),
                                 static_cast<int>(materials.size()));
            }
          }
        }
      }

      continue;
    }

    // group name
    if (token[0] == 'g' && IS_SPACE((token[1]))) {
      names.clear();

      while (!IS_NEW_LINE(token[0])) {
        std::string str = parseString(&token);
        names.push_back(str);
        token += strspn(token, " \t\r");  // skip tag
      }

      assert(names.size() > 0);

      if (callback.group_cb) {
        if (names.size() > 1) {
          // create const char* array.
          names_out.resize(names.size() - 1);
          for (size_t j = 0; j < names_out.size(); j++) {
            names_out[j] = names[j + 1].c_str();
          }
          callback.group_cb(user_data, &names_out.at(0),
                            static_cast<int>(names_out.size()));

        } else {
          callback.group_cb(user_data, NULL, 0);
        }
      }

      continue;
    }

    // object name
    if (token[0] == 'o' && IS_SPACE((token[1]))) {
      // @todo { multiple object name? }
      token += 2;

      std::stringstream ss;
      ss << token;
      std::string object_name = ss.str();

      if (callback.object_cb) {
        callback.object_cb(user_data, object_name.c_str());
      }

      continue;
    }

#if 0  // @todo
    if (token[0] == 't' && IS_SPACE(token[1])) {
      tag_t tag;

      token += 2;
      std::stringstream ss;
      ss << token;
      tag.name = ss.str();

      token += tag.name.size() + 1;

      tag_sizes ts = parseTagTriple(&token);

      tag.intValues.resize(static_cast<size_t>(ts.num_ints));

      for (size_t i = 0; i < static_cast<size_t>(ts.num_ints); ++i) {
        tag.intValues[i] = atoi(token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.floatValues.resize(static_cast<size_t>(ts.num_reals));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_reals); ++i) {
        tag.floatValues[i] = parseReal(&token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.stringValues.resize(static_cast<size_t>(ts.num_strings));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_strings); ++i) {
        std::stringstream ss;
        ss << token;
        tag.stringValues[i] = ss.str();
        token += tag.stringValues[i].size() + 1;
      }

      tags.push_back(tag);
    }
#endif

    // Ignore unknown command.
  }

  if (err) {
    (*err) += errss.str();
  }

  return true;
}